

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O0

void __thiscall Assimp::ScaleProcess::applyScaling(ScaleProcess *this,aiNode *currentNode)

{
  float *this_00;
  aiVector3t<float> aVar1;
  aiMatrix4x4t<float> local_1c4;
  aiMatrix4x4t<float> local_184;
  aiMatrix3x3t<float> local_144;
  undefined1 local_120 [8];
  aiMatrix4x4 RotMatrix;
  aiMatrix4x4 scaling;
  float local_98;
  aiVector3t<float> local_8c;
  undefined1 local_80 [8];
  aiMatrix4x4 translation;
  aiQuaternion rotation;
  aiVector3D scale;
  aiVector3D pos;
  aiNode *currentNode_local;
  ScaleProcess *this_local;
  
  if (currentNode != (aiNode *)0x0) {
    this_00 = &scale.y;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)this_00);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&rotation.y);
    aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&translation.d3);
    aiMatrix4x4t<float>::Decompose
              (&currentNode->mTransformation,(aiVector3t<float> *)&rotation.y,
               (aiQuaterniont<float> *)&translation.d3,(aiVector3t<float> *)this_00);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_80);
    aVar1 = ::operator*((aiVector3t<float> *)this_00,this->mScale);
    scaling._56_8_ = aVar1._0_8_;
    local_8c.x = scaling.d3;
    local_8c.y = scaling.d4;
    local_98 = aVar1.z;
    local_8c.z = local_98;
    aiMatrix4x4t<float>::Translation(&local_8c,(aiMatrix4x4t<float> *)local_80);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&RotMatrix.d3);
    aiMatrix4x4t<float>::Scaling
              ((aiVector3t<float> *)&rotation.y,(aiMatrix4x4t<float> *)&RotMatrix.d3);
    aiQuaterniont<float>::GetMatrix(&local_144,(aiQuaterniont<float> *)&translation.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_120,&local_144);
    aiMatrix4x4t<float>::operator*
              (&local_1c4,(aiMatrix4x4t<float> *)local_80,(aiMatrix4x4t<float> *)local_120);
    aiMatrix4x4t<float>::operator*(&local_184,&local_1c4,(aiMatrix4x4t<float> *)&RotMatrix.d3);
    memcpy(&currentNode->mTransformation,&local_184,0x40);
  }
  return;
}

Assistant:

void ScaleProcess::applyScaling( aiNode *currentNode ) {
    if ( nullptr != currentNode ) {
        // Reconstruct matrix by transform rather than by scale 
        // This prevent scale values being changed which can
        // be meaningful in some cases 
        // like when you want the modeller to 
        // see 1:1 compatibility.
        
        aiVector3D pos, scale;
        aiQuaternion rotation;
        currentNode->mTransformation.Decompose( scale, rotation, pos);
        
        aiMatrix4x4 translation;
        aiMatrix4x4::Translation( pos * mScale, translation );
        
        aiMatrix4x4 scaling;

        // note: we do not use mScale here, this is on purpose.
        aiMatrix4x4::Scaling( scale, scaling );

        aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

        currentNode->mTransformation = translation * RotMatrix * scaling;
    }
}